

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O1

int ncnn::binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx_functor::binary_op_div>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  ulong uVar7;
  undefined1 (*pauVar8) [32];
  uint uVar9;
  undefined1 (*pauVar10) [32];
  undefined1 (*pauVar11) [32];
  int iVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float in_register_000012dc;
  
  uVar3 = a->c;
  uVar9 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,opt->blob_allocator);
  iVar12 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    if (0 < (int)uVar3) {
      uVar7 = 0;
      do {
        pauVar8 = (undefined1 (*) [32])(a->cstep * uVar7 * a->elemsize + (long)a->data);
        pauVar10 = (undefined1 (*) [32])(b->cstep * uVar7 * b->elemsize + (long)b->data);
        pauVar11 = (undefined1 (*) [32])(c->cstep * uVar7 * c->elemsize + (long)c->data);
        if ((int)uVar9 < 8) {
          uVar13 = 0;
        }
        else {
          iVar12 = 7;
          do {
            auVar2 = *pauVar10;
            auVar5 = vrcpps_avx(auVar2);
            auVar17 = *pauVar8;
            fVar19 = auVar17._0_4_ * auVar5._0_4_;
            fVar20 = auVar17._4_4_ * auVar5._4_4_;
            fVar21 = auVar17._8_4_ * auVar5._8_4_;
            fVar22 = auVar17._12_4_ * auVar5._12_4_;
            fVar23 = auVar17._16_4_ * auVar5._16_4_;
            fVar24 = auVar17._20_4_ * auVar5._20_4_;
            fVar25 = auVar17._24_4_ * auVar5._24_4_;
            auVar6._4_4_ = auVar2._4_4_ * fVar20;
            auVar6._0_4_ = auVar2._0_4_ * fVar19;
            auVar6._8_4_ = auVar2._8_4_ * fVar21;
            auVar6._12_4_ = auVar2._12_4_ * fVar22;
            auVar6._16_4_ = auVar2._16_4_ * fVar23;
            auVar6._20_4_ = auVar2._20_4_ * fVar24;
            auVar6._24_4_ = auVar2._24_4_ * fVar25;
            auVar6._28_4_ = auVar2._28_4_;
            auVar2 = vsubps_avx(auVar17,auVar6);
            auVar17._0_4_ = fVar19 + auVar5._0_4_ * auVar2._0_4_;
            auVar17._4_4_ = fVar20 + auVar5._4_4_ * auVar2._4_4_;
            auVar17._8_4_ = fVar21 + auVar5._8_4_ * auVar2._8_4_;
            auVar17._12_4_ = fVar22 + auVar5._12_4_ * auVar2._12_4_;
            auVar17._16_4_ = fVar23 + auVar5._16_4_ * auVar2._16_4_;
            auVar17._20_4_ = fVar24 + auVar5._20_4_ * auVar2._20_4_;
            auVar17._24_4_ = fVar25 + auVar5._24_4_ * auVar2._24_4_;
            auVar17._28_4_ = in_register_000012dc + auVar2._28_4_;
            *pauVar11 = auVar17;
            pauVar8 = pauVar8 + 1;
            pauVar10 = pauVar10 + 1;
            pauVar11 = pauVar11 + 1;
            iVar12 = iVar12 + 8;
            uVar13 = uVar9 & 0xfffffff8;
          } while (iVar12 < (int)uVar9);
        }
        uVar15 = uVar13 | 3;
        while ((int)uVar15 < (int)uVar9) {
          auVar1 = *(undefined1 (*) [16])*pauVar8;
          auVar16 = *(undefined1 (*) [16])*pauVar10;
          auVar4 = vrcpps_avx(auVar16);
          fVar19 = auVar1._0_4_ * auVar4._0_4_;
          fVar20 = auVar1._4_4_ * auVar4._4_4_;
          fVar21 = auVar1._8_4_ * auVar4._8_4_;
          fVar22 = auVar1._12_4_ * auVar4._12_4_;
          in_register_000012dc = 0.0;
          auVar18._0_4_ = auVar16._0_4_ * fVar19;
          auVar18._4_4_ = auVar16._4_4_ * fVar20;
          auVar18._8_4_ = auVar16._8_4_ * fVar21;
          auVar18._12_4_ = auVar16._12_4_ * fVar22;
          auVar1 = vsubps_avx(auVar1,auVar18);
          auVar16._0_4_ = fVar19 + auVar4._0_4_ * auVar1._0_4_;
          auVar16._4_4_ = fVar20 + auVar4._4_4_ * auVar1._4_4_;
          auVar16._8_4_ = fVar21 + auVar4._8_4_ * auVar1._8_4_;
          auVar16._12_4_ = fVar22 + auVar4._12_4_ * auVar1._12_4_;
          *(undefined1 (*) [16])*pauVar11 = auVar16;
          pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
          pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
          pauVar11 = (undefined1 (*) [32])((long)*pauVar11 + 0x10);
          uVar15 = uVar13 + 7;
          uVar13 = uVar13 + 4;
        }
        if (uVar9 - uVar13 != 0 && (int)uVar13 <= (int)uVar9) {
          lVar14 = 0;
          do {
            *(float *)((long)*pauVar11 + lVar14 * 4) =
                 *(float *)(*pauVar8 + lVar14 * 4) / *(float *)(*pauVar10 + lVar14 * 4);
            lVar14 = lVar14 + 1;
          } while (uVar9 - uVar13 != (int)lVar14);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar3);
    }
    iVar12 = 0;
  }
  return iVar12;
}

Assistant:

static int binary_op_7_13_19_29(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 7 13 19 29
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}